

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTimeValidator.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::DateTimeValidator::compare
          (DateTimeValidator *this,XMLCh *value1,XMLCh *value2,MemoryManager *manager)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_90;
  OutOfMemoryException *anon_var_0;
  int result;
  Janitor<xercesc_4_0::XMLDateTime> jName2;
  XMLDateTime *pDate2;
  Janitor<xercesc_4_0::XMLDateTime> jName1;
  XMLDateTime *pDate1;
  MemoryManager *manager_local;
  XMLCh *value2_local;
  XMLCh *value1_local;
  DateTimeValidator *this_local;
  
  iVar1 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.super_XSerializable.
            _vptr_XSerializable[0x17])(this,value1,manager);
  Janitor<xercesc_4_0::XMLDateTime>::Janitor
            ((Janitor<xercesc_4_0::XMLDateTime> *)&pDate2,
             (XMLDateTime *)CONCAT44(extraout_var,iVar1));
  iVar2 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.super_XSerializable.
            _vptr_XSerializable[0x17])(this,value2,manager);
  jName2.fData = (XMLDateTime *)CONCAT44(extraout_var_00,iVar2);
  Janitor<xercesc_4_0::XMLDateTime>::Janitor
            ((Janitor<xercesc_4_0::XMLDateTime> *)&stack0xffffffffffffffa0,jName2.fData);
  local_90 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
               super_XSerializable._vptr_XSerializable[0x19])
                       (this,(XMLDateTime *)CONCAT44(extraout_var,iVar1),jName2.fData,1);
  if (local_90 == 2) {
    local_90 = -1;
  }
  Janitor<xercesc_4_0::XMLDateTime>::~Janitor
            ((Janitor<xercesc_4_0::XMLDateTime> *)&stack0xffffffffffffffa0);
  Janitor<xercesc_4_0::XMLDateTime>::~Janitor((Janitor<xercesc_4_0::XMLDateTime> *)&pDate2);
  return local_90;
}

Assistant:

int DateTimeValidator::compare(const XMLCh* const value1
                             , const XMLCh* const value2
                             , MemoryManager* const manager)
{
    try
    {
        XMLDateTime *pDate1 = parse(value1, manager);
        Janitor<XMLDateTime> jName1(pDate1);
        XMLDateTime *pDate2 = parse(value2, manager);
        Janitor<XMLDateTime> jName2(pDate2);
        int result = compareDates(pDate1, pDate2, true);
        return (result==INDETERMINATE)? -1 : result;
    }
    catch(const OutOfMemoryException&)
    {
        throw;
    }
    catch (...) // RuntimeException e
    {
        return -1; // revisit after implement compareDates()
    }

}